

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true>::Add<Js::JavascriptString*>
          (SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true> *this,int propertyIndex,
          JavascriptString *propertyKey,PropertyAttributes attributes,bool isInitialized,
          bool isFixed,bool usedAsFixed,ScriptContext *scriptContext)

{
  JavascriptLibrary *pJVar1;
  long lVar2;
  code *pcVar3;
  DynamicTypeHandler *typeHandler;
  PropertyAttributes attributes_00;
  bool bVar4;
  undefined4 *puVar5;
  undefined7 in_register_00000009;
  SimpleDictionaryPropertyDescriptor<int> local_50;
  WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> local_48;
  DynamicTypeHandler *local_40;
  undefined4 local_34;
  
  if (propertyKey != (JavascriptString *)0x0) {
    pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    local_34 = (undefined4)CONCAT71(in_register_00000009,attributes);
    local_50.Attributes = attributes;
    local_50.propertyIndex = propertyIndex;
    local_40 = (DynamicTypeHandler *)this;
    if (isFixed || usedAsFixed) {
      TPropertyKey_IsInternalPropertyId(propertyKey);
      lVar2._0_1_ = local_40[1].propertyTypes;
      lVar2._1_1_ = local_40[1].flags;
      lVar2._2_2_ = local_40[1].offsetOfInlineSlots;
      lVar2._4_4_ = local_40[1].slotCapacity;
      if (lVar2 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x41c,
                                    "((!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr))"
                                    ,
                                    "(!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr)"
                                   );
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar5 = 0;
      }
    }
    TPropertyKey_IsInternalPropertyId(propertyKey);
    typeHandler = local_40;
    local_50._0_1_ = (usedAsFixed << 3 | isFixed << 2 | isInitialized * '\x02') + 1;
    local_48.ptr = (PrototypeChainCache<Js::NoSpecialPropertyCache> *)propertyKey;
    JsUtil::
    BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                *)local_40[1]._vptr_DynamicTypeHandler,(JavascriptString **)&local_48,&local_50);
    Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::WriteBarrierSet
              (&local_48,&pJVar1->typesWithNoSpecialPropertyProtoChain);
    attributes_00 = (PropertyAttributes)local_34;
    PrototypeChainCache<Js::NoSpecialPropertyCache>::ProcessProperty<Js::JavascriptString*>
              (local_48.ptr,typeHandler,(PropertyAttributes)local_34,propertyKey,scriptContext);
    Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
    WriteBarrierSet((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)
                    &local_48,&pJVar1->typesWithOnlyWritablePropertyProtoChain);
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<Js::JavascriptString*>
              ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)local_48.ptr,typeHandler,
               attributes_00,propertyKey,scriptContext);
  }
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::Add(
        TPropertyIndex propertyIndex,
        TPropertyKey propertyKey,
        PropertyAttributes attributes,
        bool isInitialized, bool isFixed, bool usedAsFixed,
        ScriptContext *const scriptContext)
    {
        JavascriptLibrary* library = scriptContext->GetLibrary();
        //
        // For a function with same named parameters,
        // property id Constants::NoProperty will be passed for all the dups except the last one
        // We need to allocate space for dups, but don't add those to map
        if (propertyKey != NULL)
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor(propertyIndex, attributes);
            Assert((!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr));
            if (TPropertyKey_IsInternalPropertyId(propertyKey) || TMapKey_IsSymbol(propertyKey, scriptContext))
            {
                Assert(!TMapKey_IsJavascriptString<TMapKey>());
                hasNamelessPropertyId = true;
            }
#if ENABLE_FIXED_FIELDS
            descriptor.isInitialized = isInitialized;
            descriptor.isFixed = isFixed;
            descriptor.usedAsFixed = usedAsFixed;
#endif
            propertyMap->Add(TMapKey_ConvertKey<TMapKey>(scriptContext, propertyKey), descriptor);

            library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, attributes, propertyKey, scriptContext);
            library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, attributes, propertyKey, scriptContext);
        }
    }